

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_decrement_topology(Executor *this)

{
  __pthread_internal_list *p_Var1;
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,in_RDI);
  p_Var1 = (__pthread_internal_list *)
           ((long)&in_RDI[4].super___mutex_base._M_mutex.__data.__list.__prev[-1].__next + 7);
  in_RDI[4].super___mutex_base._M_mutex.__data.__list.__prev = p_Var1;
  if (p_Var1 == (__pthread_internal_list *)0x0) {
    std::condition_variable::notify_all();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x113176);
  return;
}

Assistant:

inline void Executor::_decrement_topology() {
#if __cplusplus >= TF_CPP20
  if(_num_topologies.fetch_sub(1, std::memory_order_acq_rel) == 1) {
    _num_topologies.notify_all();
  }
#else
  std::lock_guard<std::mutex> lock(_topology_mutex);
  if(--_num_topologies == 0) {
    _topology_cv.notify_all();
  }
#endif
}